

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mod2sparse_extra.c
# Opt level: O1

void mod2sparse_print_terminal(mod2sparse *A)

{
  uint uVar1;
  mod2dense *r;
  int row;
  int col;
  
  r = mod2dense_allocate(A->n_rows,A->n_cols);
  mod2sparse_to_dense(A,r);
  if (0 < r->n_rows) {
    row = 0;
    do {
      if (0 < r->n_cols) {
        col = 0;
        do {
          uVar1 = mod2dense_get(r,row,col);
          printf("%d",(ulong)uVar1);
          col = col + 1;
        } while (col < r->n_cols);
      }
      putchar(10);
      row = row + 1;
    } while (row < r->n_rows);
  }
  mod2dense_free(r);
  return;
}

Assistant:

void mod2sparse_print_terminal(mod2sparse *A){
  int M,N;
  mod2dense *Adense;
  M=mod2sparse_rows(A);
  N=mod2sparse_cols(A);

  Adense=mod2dense_allocate(M,N);

  mod2sparse_to_dense(A,Adense);
for (int i = 0; i<mod2dense_rows(Adense); i++)
  { for (int j = 0; j<mod2dense_cols(Adense); j++)
    { printf("%d",mod2dense_get(Adense,i,j));
    }
    printf("\n");
  }

  mod2dense_free(Adense);

}